

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::
Marray<unsigned_char,true,std::allocator<unsigned_long>>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,
          View<unsigned_char,_true,_std::allocator<unsigned_long>_> *in)

{
  size_t *psVar1;
  long lVar2;
  unsigned_long *__dest;
  size_t sVar3;
  void *pvVar4;
  runtime_error *prVar5;
  ulong uVar6;
  const_iterator it;
  Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> local_48;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<unsigned_char,std::allocator<unsigned_long>>)0x1;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(in);
  if (in != (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)this) {
    sVar3 = (in->geometry_).dimension_;
    __dest = *(unsigned_long **)(this + 0x10);
    if (sVar3 != *(size_t *)(this + 0x28)) {
      operator_delete(__dest,*(size_t *)(this + 0x28) * 0x18);
      sVar3 = (in->geometry_).dimension_;
      *(size_t *)(this + 0x28) = sVar3;
      __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),sVar3 * 3,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = __dest;
      *(unsigned_long **)(this + 0x18) = __dest + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = __dest + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      sVar3 = (in->geometry_).dimension_;
      *(size_t *)(this + 0x28) = sVar3;
    }
    memcpy(__dest,(in->geometry_).shape_,sVar3 * 0x18);
    *(size_t *)(this + 0x30) = (in->geometry_).size_;
    *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
    this[0x3c] = (Marray<unsigned_char,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
  }
  if (in->data_ == (pointer)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Assertion failed.");
LAB_00108b01:
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in->geometry_).dimension_ != 0) {
    psVar1 = (in->geometry_).shapeStrides_;
    lVar2 = *(long *)(this + 0x20);
    uVar6 = 0;
    do {
      if (*(ulong *)(this + 0x28) <= uVar6) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Assertion failed.");
        goto LAB_00108b01;
      }
      *(size_t *)(lVar2 + uVar6 * 8) = psVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < (in->geometry_).dimension_);
  }
  this[0x3c] = (Marray<unsigned_char,std::allocator<unsigned_long>>)0x1;
  uVar6 = (in->geometry_).size_;
  if (uVar6 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
LAB_00108ab3:
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Assertion failed.");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = operator_new(uVar6);
  }
  *(void **)this = pvVar4;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(in);
  if ((in->geometry_).isSimple_ == true) {
    memcpy(*(void **)this,in->data_,(in->geometry_).size_);
  }
  else {
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(in);
    Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::Iterator(&local_48,in,0);
    for (uVar6 = 0; uVar6 < *(ulong *)(this + 0x30); uVar6 = uVar6 + 1) {
      if ((local_48.view_ == (view_pointer)0x0) ||
         (((local_48.view_)->geometry_).size_ <= local_48.index_)) goto LAB_00108ab3;
      *(uchar *)(*(long *)this + uVar6) = *local_48.pointer_;
      Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator++(&local_48);
    }
    if (local_48.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<unsigned_char,std::allocator<unsigned_long>>)0x0) {
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Assertion failed.");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}